

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O2

void __thiscall
TPZGenSubStruct::InitializeDohrCondense
          (TPZGenSubStruct *this,TPZAutoPointer<TPZMatrix<double>_> *dohrmatrix,
          TPZAutoPointer<TPZDohrAssembly<double>_> *assembly)

{
  TPZMatrix<double> *pTVar1;
  TPZVec<int> *pTVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  long *plVar6;
  int64_t iVar7;
  ulong uVar8;
  TPZSubCompMesh *pTVar9;
  TPZDohrSubstructCondense<double> *this_00;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  TPZDohrAssembly<double> *dohrassembly;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> substruct;
  key_type local_e0;
  TPZAutoPointer<TPZCompMesh> local_d8;
  ulong local_d0;
  TPZSubCompMesh *local_c8;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> local_c0;
  TPZAutoPointer<TPZDohrSubstructCondense<double>_> local_b8;
  TPZAutoPointer<TPZCompMesh> local_b0;
  TPZVec<std::pair<int,_int>_> globaleqs;
  key_type local_68;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> globinv;
  
  pTVar1 = dohrmatrix->fRef->fPointer;
  if (pTVar1 == (TPZMatrix<double> *)0x0) {
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = (long *)__dynamic_cast(pTVar1,&TPZMatrix<double>::typeinfo,
                                    &TPZDohrMatrix<double,TPZDohrSubstructCondense<double>>::
                                     typeinfo,0);
  }
  (**(code **)(*(long *)((this->fCMesh).fRef)->fPointer + 0x78))();
  iVar7 = TPZCompMesh::NEquations(((this->fCMesh).fRef)->fPointer);
  (**(code **)(*plVar6 + 0x68))(plVar6,(long)(int)iVar7);
  *(int *)(plVar6 + 7) = (int)(this->fCornerEqs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_b0.fRef = (this->fCMesh).fRef;
  LOCK();
  ((local_b0.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_b0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  uVar8 = NSubMesh(&local_b0);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_b0);
  iVar5 = (int)uVar8;
  TPZVec<TPZVec<int>_>::Resize(&assembly->fRef->fPointer->fFineEqs,(long)iVar5);
  TPZVec<TPZVec<int>_>::Resize(&assembly->fRef->fPointer->fCoarseEqs,(long)iVar5);
  std::operator<<((ostream *)&std::cout,"Computing the system of equations for each substructure\n")
  ;
  uVar8 = uVar8 & 0xffffffff;
  if (iVar5 < 1) {
    uVar8 = 0;
  }
  for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
    local_d8.fRef = (this->fCMesh).fRef;
    LOCK();
    ((local_d8.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_d8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pTVar9 = SubMesh(&local_d8,(int)uVar15);
    TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_d8);
    local_c8 = pTVar9;
    if (pTVar9 != (TPZSubCompMesh *)0x0) {
      std::operator<<((ostream *)&std::cout,'*');
      std::ostream::flush();
      this_00 = (TPZDohrSubstructCondense<double> *)operator_new(0x450);
      TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense(this_00);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::TPZAutoPointer(&substruct,this_00);
      pTVar9 = local_c8;
      local_d0 = TPZCompMesh::NEquations(&local_c8->super_TPZCompMesh);
      (substruct.fRef)->fPointer->fNEquations = (int)local_d0;
      globinv._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      globinv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      globinv._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &globinv._M_t._M_impl.super__Rb_tree_header._M_header;
      globinv._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      globaleqs._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016f3038;
      globaleqs.fStore = (pair<int,_int> *)0x0;
      globaleqs.fNElements = 0;
      globaleqs.fNAlloc = 0;
      globinv._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           globinv._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      IdentifyEqNumbers(this,pTVar9,&globaleqs,&globinv);
      iVar7 = globaleqs.fNElements;
      iVar5 = (int)globaleqs.fNElements;
      (substruct.fRef)->fPointer->fNumExternalEquations = iVar5;
      pTVar2 = (assembly->fRef->fPointer->fFineEqs).fStore;
      (*pTVar2[uVar15]._vptr_TPZVec[3])(pTVar2 + uVar15,(long)iVar5);
      uVar14 = iVar7 & 0xffffffff;
      if (iVar5 < 1) {
        uVar14 = 0;
      }
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        (assembly->fRef->fPointer->fFineEqs).fStore[uVar15].fStore[uVar12] =
             globaleqs.fStore[uVar12].second;
      }
      local_e0.first = Submesh;
      local_e0.second = ExternalFirst;
      pmVar10 = std::
                map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                ::operator[](&(substruct.fRef)->fPointer->fPermutationsScatter,&local_e0);
      local_e0.first = ExternalFirst;
      local_e0.second = Submesh;
      pmVar11 = std::
                map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                ::operator[](&(substruct.fRef)->fPointer->fPermutationsScatter,&local_e0);
      lVar13 = (long)(int)local_d0;
      local_e0.first = ~Submesh;
      (*pmVar10->_vptr_TPZVec[2])(pmVar10,lVar13,&local_e0);
      local_e0.first = ~Submesh;
      (*pmVar11->_vptr_TPZVec[2])(pmVar11,lVar13,&local_e0);
      pTVar9 = local_c8;
      piVar3 = pmVar10->fStore;
      uVar14 = 0;
      if (0 < (int)globaleqs.fNElements) {
        uVar14 = globaleqs.fNElements & 0xffffffff;
      }
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        piVar3[globaleqs.fStore[uVar12].first] = (int)uVar12;
      }
      piVar3 = pmVar10->fStore;
      uVar14 = 0;
      if (0 < (int)local_d0) {
        uVar14 = local_d0 & 0xffffffff;
      }
      iVar5 = (int)globaleqs.fNElements;
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        if (piVar3[uVar12] == -1) {
          piVar3[uVar12] = iVar5;
          iVar5 = iVar5 + 1;
        }
      }
      piVar3 = pmVar10->fStore;
      piVar4 = pmVar11->fStore;
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        piVar4[piVar3[uVar12]] = (int)uVar12;
      }
      local_e0.first = Submesh;
      local_e0.second = InternalFirst;
      pmVar10 = std::
                map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                ::operator[](&(substruct.fRef)->fPointer->fPermutationsScatter,&local_e0);
      local_68.first = InternalFirst;
      local_68.second = Submesh;
      pmVar11 = std::
                map<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
                ::operator[](&(substruct.fRef)->fPointer->fPermutationsScatter,&local_68);
      ComputeInternalEquationPermutation(pTVar9,pmVar10,pmVar11);
      IdentifySubCornerEqs
                (this,&globinv,&(substruct.fRef)->fPointer->fCoarseNodes,
                 (assembly->fRef->fPointer->fCoarseEqs).fStore + uVar15);
      local_b8.fRef = substruct.fRef;
      LOCK();
      ((substruct.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((substruct.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      InitializeMatrices(pTVar9,&local_b8,dohrassembly);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer(&local_b8);
      local_c0.fRef = substruct.fRef;
      LOCK();
      ((substruct.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((substruct.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      std::__cxx11::
      list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
      ::push_back((list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                   *)(plVar6 + 4),&local_c0);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer(&local_c0);
      TPZVec<std::pair<int,_int>_>::~TPZVec(&globaleqs);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&globinv._M_t);
      TPZAutoPointer<TPZDohrSubstructCondense<double>_>::~TPZAutoPointer(&substruct);
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void TPZGenSubStruct::InitializeDohrCondense(TPZAutoPointer<TPZMatrix<STATE> > dohrmatrix, TPZAutoPointer<TPZDohrAssembly<STATE> > assembly)
{
	//Isolate each subcompmesh and put it in the dohrmann matrix
	TPZDohrMatrix<STATE,TPZDohrSubstructCondense<STATE> > *dohr = dynamic_cast<TPZDohrMatrix<STATE,TPZDohrSubstructCondense<STATE> > *>(dohrmatrix.operator->());
	fCMesh->ComputeNodElCon();
	
	int neq = fCMesh->NEquations();
	dohr->Resize(neq,neq);
	// fCornerEqs was initialized during the mesh generation process
    dohr->SetNumCornerEqs(this->fCornerEqs.size());
	
	int nsub = NSubMesh(fCMesh);
	assembly->fFineEqs.Resize(nsub);
	assembly->fCoarseEqs.Resize(nsub);
	int isub;
	std::cout << "Computing the system of equations for each substructure\n";
	for(isub=0; isub<nsub; isub++)
	{
		TPZSubCompMesh *submesh = SubMesh(fCMesh, isub);
		if(!submesh) 
		{
			continue;
		}
		std::cout << '*';
		// creating the substructure HERE
		std::cout.flush();
		TPZAutoPointer<TPZDohrSubstructCondense<STATE> > substruct = new TPZDohrSubstructCondense<STATE>();

		// compute the stiffness matrix
		int neq = ((TPZCompMesh *)submesh)->NEquations();
		//    int neq = substruct->fStiffness->Rows();
		
		substruct->fNEquations = neq;

		// identify the equation numbers of the submesh
		std::map<int,int> globinv;
		// initialize the fGlobalIndex data structure
		// fGlobalIndex will have -1 entries for internal equations
		// we need to dismember this (again) in two vectors
		TPZVec<std::pair<int,int> > globaleqs;
		IdentifyEqNumbers(submesh, globaleqs ,globinv);
		int next = globaleqs.NElements();
		substruct->fNumExternalEquations = next;
		assembly->fFineEqs[isub].Resize(next);
		int ieq;
		for(ieq=0; ieq<next; ieq++)
		{
			assembly->fFineEqs[isub][ieq] = globaleqs[ieq].second; 
		}
		
		// initialize the permutations from the mesh enumeration to the external enumeration
		typedef TPZDohrSubstructCondense<STATE>::ENumbering ENumbering;
		typedef std::pair<ENumbering,ENumbering> Numberingpair;
		ENumbering tsub,text,tint;
		tsub = TPZDohrSubstructCondense<STATE>::Submesh;
		text = TPZDohrSubstructCondense<STATE>::ExternalFirst;
		tint = TPZDohrSubstructCondense<STATE>::InternalFirst;
		
		TPZVec<int> &toexternal = substruct->fPermutationsScatter[Numberingpair(tsub,text)];
		TPZVec<int> &fromexternal = substruct->fPermutationsScatter[Numberingpair(text,tsub)];
		toexternal.Resize(neq,-1);
		fromexternal.Resize(neq,-1);
		int nel = globaleqs.NElements();
		
		for(ieq=0; ieq<nel; ieq++)
		{
			toexternal[globaleqs[ieq].first] = ieq;
		}
		int count = nel++;
		for(ieq=0; ieq<neq; ieq++)
		{
			if(toexternal[ieq] == -1) toexternal[ieq] = count++;
		}
		for(ieq=0; ieq<neq; ieq++)
		{
			fromexternal[toexternal[ieq]] = ieq;
		}
		
		ComputeInternalEquationPermutation(submesh, substruct->fPermutationsScatter[Numberingpair(tsub,tint)], substruct->fPermutationsScatter[Numberingpair(tint,tsub)]);
		//		IdentifyEqNumbers(submesh, substruct->fGlobalIndex,globinv);
		
		// initialize the fC matrix
		// associate each column of the fC matrix with a coarse index
		IdentifySubCornerEqs(globinv,substruct->fCoarseNodes,assembly->fCoarseEqs[isub]);
		//		int ncoarse = substruct->fCoarseNodes.NElements();
		
		// reorder by internal nodes
		// the fInternalEqs data structure will not be filled if the connects are made internal
		
		// this permutes the nodes of the submesh
		// This is a lengthy process which should run on the remote processor
		InitializeMatrices(submesh, substruct,  assembly);
		
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "The coarse equations are " << assembly->fCoarseEqs[isub] << std::endl;
			/*      sout << "Submesh for element " << iel << std::endl;
			 submesh->Print(sout);*/
			sout << "Substructure for submesh " << isub << std::endl;
			substruct->Print(sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		dohr->AddSubstruct(substruct);
	}
	std::cout << std::endl;
}